

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_delete(curl_hash *h,void *key,size_t key_len)

{
  curl_llist **ppcVar1;
  curl_llist *list;
  size_t sVar2;
  curl_llist *l;
  curl_hash_element *he;
  curl_llist_element *le;
  size_t key_len_local;
  void *key_local;
  curl_hash *h_local;
  
  ppcVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  list = ppcVar1[sVar2];
  he = (curl_hash_element *)list->head;
  while( true ) {
    if (he == (curl_hash_element *)0x0) {
      return 1;
    }
    sVar2 = (*h->comp_func)(*(void **)((long)he->ptr + 8),*(size_t *)((long)he->ptr + 0x10),key,
                            key_len);
    if (sVar2 != 0) break;
    he = (curl_hash_element *)he->key_len;
  }
  Curl_llist_remove(list,(curl_llist_element *)he,h);
  h->size = h->size - 1;
  return 0;
}

Assistant:

int Curl_hash_delete(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_hash_element  *he;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}